

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void console_message_integer(char *mes,int num)

{
  uint in_ESI;
  char *in_RDI;
  
  fprintf(_stderr,in_RDI,(ulong)in_ESI);
  return;
}

Assistant:

void console_message_integer(const char *mes, int num)
{
#if defined(_WIN32)
	char *temp = u8tosjis(mes);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return;
	}
	fprintf(stderr, temp, num);
	free(temp);
#else
	fprintf(stderr, mes, num);
#endif
}